

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmfilelockmgr.cpp
# Opt level: O2

PAL_ERROR FILEAddNewLockedRgn(SHMFILELOCKS *fileLocks,PVOID pvControllerInstance,
                             SHMFILELOCKRGNS *insertAfter,UINT64 lockRgnStart,UINT64 nbBytesToLock,
                             LOCK_TYPE lockType)

{
  DWORD DVar1;
  SHMPTR shmptr;
  DWORD *pDVar2;
  SHMFILELOCKRGNS *pSVar3;
  SHMFILELOCKRGNS *pSVar4;
  PAL_ERROR PVar5;
  undefined8 uVar6;
  
  if (fileLocks == (SHMFILELOCKS *)0x0 || pvControllerInstance == (PVOID)0x0) {
    fprintf(_stderr,"] %s %s:%d","FILEAddNewLockedRgn",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/shmfilelockmgr.cpp"
            ,0x330);
    fprintf(_stderr,"Invalid Null parameter.\n");
    return 0;
  }
  SHMLock();
  if (PAL_InitializeChakraCoreCalled == false) {
LAB_001292e6:
    abort();
  }
  shmptr = SHMalloc(0x30);
  if (shmptr == 0) {
    if (PAL_InitializeChakraCoreCalled == false) goto LAB_001292e6;
    PVar5 = 8;
    goto LAB_001292d0;
  }
  pDVar2 = (DWORD *)SHMPtrToPtr(shmptr);
  if (pDVar2 == (DWORD *)0x0) {
    uVar6 = 0x343;
  }
  else {
    DVar1 = GetCurrentProcessId();
    *pDVar2 = DVar1;
    *(PVOID *)(pDVar2 + 2) = pvControllerInstance;
    *(UINT64 *)(pDVar2 + 4) = lockRgnStart;
    *(UINT64 *)(pDVar2 + 6) = nbBytesToLock;
    pDVar2[8] = lockType;
    if (insertAfter == (SHMFILELOCKRGNS *)0x0) {
      if (fileLocks->fileLockedRgns == 0) goto LAB_00129247;
      pSVar3 = (SHMFILELOCKRGNS *)SHMPtrToPtr(fileLocks->fileLockedRgns);
      if (pSVar3 != (SHMFILELOCKRGNS *)0x0) goto LAB_00129249;
      uVar6 = 0x35d;
    }
    else {
      if (insertAfter->next == 0) {
LAB_00129247:
        pSVar3 = (SHMFILELOCKRGNS *)0x0;
      }
      else {
        pSVar3 = (SHMFILELOCKRGNS *)SHMPtrToPtr(insertAfter->next);
        if (pSVar3 == (SHMFILELOCKRGNS *)0x0) {
          uVar6 = 0x354;
          goto LAB_001291de;
        }
      }
LAB_00129249:
      do {
        pSVar4 = pSVar3;
        if (((pSVar4 == (SHMFILELOCKRGNS *)0x0) || (pSVar4->lockRgnStart != *(UINT64 *)(pDVar2 + 4))
            ) || (*(ulong *)(pDVar2 + 6) <= pSVar4->nbBytesLocked)) {
          if (insertAfter == (SHMFILELOCKRGNS *)0x0) {
            if (PAL_InitializeChakraCoreCalled == false) goto LAB_001292e6;
            *(SHMPTR *)(pDVar2 + 10) = fileLocks->fileLockedRgns;
            fileLocks->fileLockedRgns = shmptr;
          }
          else {
            if (PAL_InitializeChakraCoreCalled == false) goto LAB_001292e6;
            *(SHMPTR *)(pDVar2 + 10) = insertAfter->next;
            insertAfter->next = shmptr;
          }
          PVar5 = 0;
          goto LAB_001292d0;
        }
        pSVar3 = (SHMFILELOCKRGNS *)0x0;
        insertAfter = pSVar4;
      } while ((pSVar4->next == 0) ||
              (pSVar3 = (SHMFILELOCKRGNS *)SHMPtrToPtr(pSVar4->next),
              pSVar3 != (SHMFILELOCKRGNS *)0x0));
      uVar6 = 0x36b;
    }
  }
LAB_001291de:
  fprintf(_stderr,"] %s %s:%d","FILEAddNewLockedRgn",
          "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/shmfilelockmgr.cpp"
          ,uVar6);
  fprintf(_stderr,"Unable to get pointer from shm pointer.\n");
  SHMfree(shmptr);
  PVar5 = 0x54f;
LAB_001292d0:
  SHMRelease();
  return PVar5;
}

Assistant:

PAL_ERROR
FILEAddNewLockedRgn(
    SHMFILELOCKS* fileLocks,
    PVOID pvControllerInstance, 
    SHMFILELOCKRGNS *insertAfter,
    UINT64 lockRgnStart, 
    UINT64 nbBytesToLock, 
    LOCK_TYPE lockType
    )
{
    PAL_ERROR palError = NO_ERROR;
    SHMFILELOCKRGNS *newLockRgn, *lockRgnPtr;
    SHMPTR shmNewLockRgn = SHMNULL;

    if ((fileLocks == NULL) || (pvControllerInstance == NULL))
    {
        ASSERT("Invalid Null parameter.\n");
        return FALSE;
    }

    SHMLock();
    
    /* Create a new entry for the new locked region */
    TRACE("Create a new entry for the new lock region (%I64u %I64u)\n", 
          lockRgnStart, nbBytesToLock);
    
    if ((shmNewLockRgn = SHMalloc(sizeof(SHMFILELOCKRGNS))) == SHMNULL)
    {
        ERROR("Can't allocate SHMFILELOCKRGNS structure\n");
        palError = ERROR_NOT_ENOUGH_MEMORY;
        goto EXIT;
    }

    if (SHMPTR_TO_TYPED_PTR_BOOL(SHMFILELOCKRGNS, newLockRgn, shmNewLockRgn) == FALSE)
    {
        ASSERT("Unable to get pointer from shm pointer.\n");
        palError = ERROR_INTERNAL_ERROR;
        goto EXIT;
    }
    
    newLockRgn->processId = GetCurrentProcessId();
    newLockRgn->pvControllerInstance = pvControllerInstance;
    newLockRgn->lockRgnStart = lockRgnStart;
    newLockRgn->nbBytesLocked = nbBytesToLock;
    newLockRgn->lockType = lockType;
    
    /* All locked regions with the same offset should be sorted ascending */
    /* the sort is based on the length of the locked byte range */
    if (insertAfter != NULL)
    {
        if (SHMPTR_TO_TYPED_PTR_BOOL(SHMFILELOCKRGNS, lockRgnPtr, insertAfter->next) == FALSE)
        {
            ASSERT("Unable to get pointer from shm pointer.\n");
            palError = ERROR_INTERNAL_ERROR;
            goto EXIT;
        }
    }
    else
    {
        if (SHMPTR_TO_TYPED_PTR_BOOL(SHMFILELOCKRGNS, lockRgnPtr, fileLocks->fileLockedRgns) == FALSE)
        {
            ASSERT("Unable to get pointer from shm pointer.\n");
            palError = ERROR_INTERNAL_ERROR;
            goto EXIT;
        }
    }
    
    while(lockRgnPtr != NULL)
    {
        if ( (lockRgnPtr->lockRgnStart == newLockRgn->lockRgnStart) &&
             (newLockRgn->nbBytesLocked > lockRgnPtr->nbBytesLocked))
        {
            insertAfter = lockRgnPtr;
            if (SHMPTR_TO_TYPED_PTR_BOOL(SHMFILELOCKRGNS, lockRgnPtr, lockRgnPtr->next) == FALSE)
            {
                ASSERT("Unable to get pointer from shm pointer.\n");
                palError = ERROR_INTERNAL_ERROR;
                goto EXIT;
            }
            continue;
        }

        break;
    }
    
    if (insertAfter != NULL)
    {       
        TRACE("Adding lock after the lock rgn (%I64d %I64d)\n", 
              insertAfter->lockRgnStart,insertAfter->nbBytesLocked);
        newLockRgn->next = insertAfter->next;
        insertAfter->next = shmNewLockRgn;
    }
    else
    {
        TRACE("adding lock into the head of the list\n");
        newLockRgn->next = fileLocks->fileLockedRgns;
        fileLocks->fileLockedRgns = shmNewLockRgn;
    }

EXIT:

    if (NO_ERROR != palError && SHMNULL != shmNewLockRgn)
    {
        SHMfree(shmNewLockRgn);
    }
   
    SHMRelease();
    
    return palError;
}